

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O0

__pid_t __thiscall QWaitConditionPrivate::wait(QWaitConditionPrivate *this,void *__stat_loc)

{
  QDeadlineTimer deadline;
  bool bVar1;
  int iVar2;
  qint64 in_RDX;
  long in_FS_OFFSET;
  int code;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  int code_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xaaaaaaaa;
  while( true ) {
    bVar1 = QDeadlineTimer::isForever((QDeadlineTimer *)this);
    if (bVar1) {
      iVar2 = pthread_cond_wait((pthread_cond_t *)((long)this + 0x28),(pthread_mutex_t *)this);
    }
    else {
      deadline.t2 = (int)lVar4;
      deadline.type = (int)((ulong)lVar4 >> 0x20);
      deadline.t1 = in_RDX;
      iVar2 = wait_relative((QWaitConditionPrivate *)CONCAT44(uVar3,in_stack_ffffffffffffffc8),
                            deadline);
    }
    if ((iVar2 != 0) || (*(int *)((long)this + 0x5c) != 0)) break;
    uVar3 = 0;
  }
  *(int *)((long)this + 0x58) = *(int *)((long)this + 0x58) + -1;
  if (iVar2 == 0) {
    *(int *)((long)this + 0x5c) = *(int *)((long)this + 0x5c) + -1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  code_00 = (int)((ulong)this >> 0x20);
  qt_report_pthread_error
            (code_00,(char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
             (char *)0x6da090);
  if ((iVar2 != 0) && (iVar2 != 0x6e)) {
    qt_report_pthread_error
              (code_00,(char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
               (char *)0x6da0b5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return (__pid_t)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),iVar2 == 0);
  }
  __stack_chk_fail();
}

Assistant:

bool wait(QDeadlineTimer deadline)
    {
        int code;
        forever {
            if (!deadline.isForever()) {
                code = wait_relative(deadline);
            } else {
                code = pthread_cond_wait(&cond, &mutex);
            }
            if (code == 0 && wakeups == 0) {
                // spurious wakeup
                continue;
            }
            break;
        }

        Q_ASSERT_X(waiters > 0, "QWaitCondition::wait", "internal error (waiters)");
        --waiters;
        if (code == 0) {
            Q_ASSERT_X(wakeups > 0, "QWaitCondition::wait", "internal error (wakeups)");
            --wakeups;
        }
        qt_report_pthread_error(pthread_mutex_unlock(&mutex), "QWaitCondition::wait()",
                                "mutex unlock");

        if (code && code != ETIMEDOUT)
            qt_report_pthread_error(code, "QWaitCondition::wait()", "cv wait");

        return (code == 0);
    }